

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openglrenderer.h
# Opt level: O1

void __thiscall rengine::OpenGLRenderer::renderToLayer(OpenGLRenderer *this,Element *e)

{
  vec2 vVar1;
  byte bVar2;
  uint uVar3;
  Node *pNVar4;
  vec2 step;
  vec2 step_00;
  mat4 o;
  mat4 o_00;
  mat4 o_01;
  mat4 o_02;
  mat4 o_03;
  mat4 o_04;
  vec2 textureSize;
  vec2 textureSize_00;
  GLuint GVar5;
  ostream *poVar6;
  long lVar7;
  int iVar8;
  mat4 *pmVar9;
  float *pfVar10;
  undefined8 *puVar11;
  mat4 *pmVar12;
  char *o_05;
  undefined8 *puVar13;
  mat4 *pmVar14;
  int iVar15;
  byte bVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  rect2d r;
  undefined4 uVar21;
  undefined4 in_stack_fffffffffffffbec;
  undefined4 uVar22;
  undefined4 in_stack_fffffffffffffbf4;
  undefined8 uVar23;
  undefined1 in_stack_fffffffffffffc00 [40];
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined4 local_3a8;
  undefined8 local_3a4;
  undefined8 uStack_39c;
  undefined8 local_394;
  float local_388 [6];
  undefined8 local_370;
  undefined8 uStack_368;
  undefined4 local_360;
  undefined8 local_35c;
  undefined8 uStack_354;
  undefined8 local_34c;
  undefined8 local_340;
  undefined4 local_338;
  float local_334;
  undefined8 local_330;
  undefined4 local_328;
  float local_324;
  undefined8 local_320;
  undefined4 local_318;
  undefined8 local_314;
  undefined8 uStack_30c;
  undefined8 local_304;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined4 local_2d0;
  undefined8 local_2cc;
  undefined8 uStack_2c4;
  undefined8 local_2bc;
  float local_2b0 [6];
  undefined8 local_298;
  undefined8 uStack_290;
  undefined4 local_288;
  undefined8 local_284;
  undefined8 uStack_27c;
  undefined8 local_274;
  undefined8 local_268;
  undefined4 local_260;
  float local_25c;
  undefined8 local_258;
  undefined4 local_250;
  float local_24c;
  undefined8 local_248;
  undefined4 local_240;
  undefined8 local_23c;
  undefined8 uStack_234;
  undefined8 local_22c;
  float local_220 [2];
  mat4 storedProjection;
  mat4 local_198;
  mat4 local_154;
  char *local_110;
  long local_108;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  vec2 local_b0;
  Node *local_a8;
  mat4 *local_a0;
  TexturePool *local_98;
  Node *local_90;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  vec2 local_68;
  undefined8 uStack_60;
  GLuint local_54;
  GLuint *local_50;
  vec2 local_48;
  undefined8 uStack_40;
  uint local_38;
  byte local_31;
  
  bVar16 = 0;
  uVar3 = *(uint *)&e->field_0x18;
  if ((uVar3 >> 0x1e & 1) == 0) {
    __assert_fail("e->layered",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/openglrenderer.h"
                  ,0x2cf,"void rengine::OpenGLRenderer::renderToLayer(Element *)");
  }
  vVar1 = this->m_vertices[e->vboOffset];
  fVar17 = vVar1.x;
  fVar19 = vVar1.y;
  vVar1 = this->m_vertices[e->vboOffset + 3];
  fVar18 = vVar1.x;
  fVar20 = vVar1.y;
  if ((0.0 < fVar18 - fVar17) && (0.0 < fVar20 - fVar19)) {
    bVar2 = this->field_0x1f8;
    local_54 = this->m_fbo;
    local_a0 = &this->m_proj;
    pmVar9 = local_a0;
    pfVar10 = local_220;
    for (lVar7 = 0x11; lVar7 != 0; lVar7 = lVar7 + -1) {
      *pfVar10 = pmVar9->m[0];
      pmVar9 = (mat4 *)(pmVar9->m + 1);
      pfVar10 = pfVar10 + 1;
    }
    local_b0 = this->m_surfaceSize;
    this->field_0x1f8 = (byte)(uVar3 >> 0x1d) & 3 | bVar2;
    pNVar4 = e->node;
    local_a8 = (Node *)0x0;
    if (pNVar4->field_0x30 == '\x04') {
      local_a8 = pNVar4;
    }
    local_90 = (Node *)0x0;
    if (pNVar4->field_0x30 == '\x05') {
      local_90 = pNVar4;
    }
    local_50 = &this->m_fbo;
    local_38 = CONCAT31(local_38._1_3_,local_a8 != (Node *)0x0 || local_90 != (Node *)0x0);
    local_68.y = fVar19;
    fStack_7c = 0.0;
    fStack_74 = fVar20;
    fStack_70 = 0.0;
    if (local_a8 != (Node *)0x0 || local_90 != (Node *)0x0) {
      fVar17 = fVar17 + -1.0;
      local_68.y = fVar19 + -1.0;
      fVar18 = fVar18 + 1.0;
      fStack_74 = fVar20 + 1.0;
      fStack_7c = fVar19;
      fStack_70 = fVar20;
    }
    local_68.x = fVar17;
    uStack_60 = CONCAT44(fStack_7c,fStack_7c);
    local_88 = fVar18 - fVar17;
    fStack_84 = fStack_74 - local_68.y;
    fStack_80 = fStack_70 - fStack_7c;
    fStack_7c = fStack_70 - fStack_7c;
    local_48.y = fStack_84;
    local_48.x = fStack_84;
    uStack_40 = CONCAT44(fStack_84,fStack_84);
    vVar1.y = fStack_84;
    vVar1.x = local_88;
    this->m_surfaceSize = vVar1;
    local_98 = &this->m_texturePool;
    local_78 = fVar18;
    fStack_6c = fStack_70;
    local_31 = bVar2;
    GVar5 = TexturePool::acquire(local_98);
    e->texture = GVar5;
    iVar8 = (int)local_88;
    iVar15 = (int)local_48.x;
    glBindTexture(0xde1,GVar5);
    glTexParameteri(0xde1,0x2801,0x2601);
    glTexParameteri(0xde1,0x2800,0x2601);
    glTexParameteri(0xde1,0x2802,0x812f);
    glTexParameteri(0xde1,0x2803,0x812f);
    uVar23 = 0;
    uVar22 = 0x1401;
    uVar21 = 0x1908;
    glTexImage2D(0xde1,0,0x1908,iVar8,iVar15,0);
    glGenFramebuffers(1,local_50);
    glBindFramebuffer(0x8d40,this->m_fbo);
    glFramebufferTexture2D(0x8d40,0x8ce0,0xde1,e->texture,0);
    iVar8 = glCheckFramebufferStatus(0x8d40);
    if (iVar8 != 0x8cd5) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"W [",3);
      log_timestring_abi_cxx11_();
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,local_110,local_108);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]: ",3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,"void rengine::OpenGLRenderer::renderToLayer(Element *)",0x36);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,": ",2);
      o_05 = "FBO failed, devRect=";
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"FBO failed, devRect=",0x14);
      r.br.y = fStack_74;
      r.br.x = local_78;
      r.tl = local_68;
      poVar6 = operator<<((rengine *)poVar6,(ostream *)o_05,r);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,", dim=",6);
      poVar6 = std::ostream::_M_insert<double>((double)local_88);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"x",1);
      poVar6 = std::ostream::_M_insert<double>((double)local_48.x);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,", tex=",6);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,", fbo=",6);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,", error=",8);
      *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
           *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 8;
      glCheckFramebufferStatus(0x8d40);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::endl<char,std::char_traits<char>>(poVar6);
      std::__cxx11::string::~string((string *)&local_110);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/openglrenderer.h"
                    ,0x2fd,"void rengine::OpenGLRenderer::renderToLayer(Element *)");
    }
    local_78 = local_68.y;
    fStack_74 = local_68.y;
    fStack_70 = local_68.y;
    fStack_6c = local_68.y;
    local_198.m[0] = 1.0;
    local_198.m[1] = 0.0;
    local_198.m[2] = 0.0;
    local_198.m[3] = 0.0;
    local_198.m[4] = 0.0;
    local_198.m[5] = -1.0;
    local_198.m[6] = 0.0;
    local_198.m[7] = 0.0;
    local_198.m[8] = 0.0;
    local_198.m[9] = 0.0;
    local_198.m[10] = 1.0;
    local_198.m[0xb] = 0.0;
    local_198.m[0xc] = 0.0;
    local_198.m[0xd] = 0.0;
    local_198.m[0xe] = 0.0;
    local_198.m[0xf] = 1.0;
    local_198.type = 2;
    local_3d0 = 0x3f800000;
    uStack_3c8 = 0xbf80000000000000;
    local_3c0 = 0x3f80000000000000;
    uStack_3b8 = 0x3f80000000000000;
    local_3b0 = 0;
    local_3a8 = 0x3f800000;
    local_3a4 = 0;
    uStack_39c = 0;
    local_394 = 0x13f800000;
    puVar11 = &local_3d0;
    puVar13 = (undefined8 *)&stack0xfffffffffffffbe8;
    for (lVar7 = 8; lVar7 != 0; lVar7 = lVar7 + -1) {
      *puVar13 = *puVar11;
      puVar11 = puVar11 + (ulong)bVar16 * -2 + 1;
      puVar13 = puVar13 + (ulong)bVar16 * -2 + 1;
    }
    o.m[1] = (float)in_stack_fffffffffffffbec;
    o.m[0] = (float)uVar21;
    o.m[2] = (float)uVar22;
    o.m[3] = (float)in_stack_fffffffffffffbf4;
    o.m[4] = (float)(int)uVar23;
    o.m[5] = (float)(int)((ulong)uVar23 >> 0x20);
    o.m[6] = (float)in_stack_fffffffffffffc00._0_4_;
    o.m[7] = (float)in_stack_fffffffffffffc00._4_4_;
    o.m[8] = (float)in_stack_fffffffffffffc00._8_4_;
    o.m[9] = (float)in_stack_fffffffffffffc00._12_4_;
    o.m[10] = (float)in_stack_fffffffffffffc00._16_4_;
    o.m[0xb] = (float)in_stack_fffffffffffffc00._20_4_;
    o.m[0xc] = (float)in_stack_fffffffffffffc00._24_4_;
    o.m[0xd] = (float)in_stack_fffffffffffffc00._28_4_;
    o.m[0xe] = (float)in_stack_fffffffffffffc00._32_4_;
    o.m[0xf] = (float)in_stack_fffffffffffffc00._36_4_;
    o.type = 1;
    mat4::operator*(&local_154,&local_198,o);
    local_388[0] = 2.0 / local_88;
    local_388[1] = 0.0;
    local_388[2] = 0.0;
    local_388[3] = 0.0;
    local_388[4] = 0.0;
    local_388[5] = -2.0 / local_48.x;
    local_370 = 0;
    uStack_368 = 0;
    local_360 = 0x3f800000;
    local_35c = 0;
    uStack_354 = 0;
    local_34c = 0x23f800000;
    pfVar10 = local_388;
    puVar11 = (undefined8 *)&stack0xfffffffffffffbe8;
    for (lVar7 = 8; lVar7 != 0; lVar7 = lVar7 + -1) {
      *puVar11 = *(undefined8 *)pfVar10;
      pfVar10 = pfVar10 + ((ulong)bVar16 * -2 + 1) * 2;
      puVar11 = puVar11 + (ulong)bVar16 * -2 + 1;
    }
    o_00.m[1] = (float)in_stack_fffffffffffffbec;
    o_00.m[0] = (float)uVar21;
    o_00.m[2] = (float)uVar22;
    o_00.m[3] = (float)in_stack_fffffffffffffbf4;
    o_00.m[4] = (float)(int)uVar23;
    o_00.m[5] = (float)(int)((ulong)uVar23 >> 0x20);
    o_00.m[6] = (float)in_stack_fffffffffffffc00._0_4_;
    o_00.m[7] = (float)in_stack_fffffffffffffc00._4_4_;
    o_00.m[8] = (float)in_stack_fffffffffffffc00._8_4_;
    o_00.m[9] = (float)in_stack_fffffffffffffc00._12_4_;
    o_00.m[10] = (float)in_stack_fffffffffffffc00._16_4_;
    o_00.m[0xb] = (float)in_stack_fffffffffffffc00._20_4_;
    o_00.m[0xc] = (float)in_stack_fffffffffffffc00._24_4_;
    o_00.m[0xd] = (float)in_stack_fffffffffffffc00._28_4_;
    o_00.m[0xe] = (float)in_stack_fffffffffffffc00._32_4_;
    o_00.m[0xf] = (float)in_stack_fffffffffffffc00._36_4_;
    o_00.type = 2;
    mat4::operator*((mat4 *)(storedProjection.m + 0xf),&local_154,o_00);
    local_340 = 0x3f800000;
    local_338 = 0;
    local_334 = -local_68.x;
    local_330 = 0x3f80000000000000;
    local_328 = 0;
    local_324 = -local_78;
    local_320 = 0;
    local_318 = 0x3f800000;
    local_314 = 0;
    uStack_30c = 0;
    local_304 = 0x13f800000;
    puVar11 = &local_340;
    puVar13 = (undefined8 *)&stack0xfffffffffffffbe8;
    for (lVar7 = 8; lVar7 != 0; lVar7 = lVar7 + -1) {
      *puVar13 = *puVar11;
      puVar11 = puVar11 + (ulong)bVar16 * -2 + 1;
      puVar13 = puVar13 + (ulong)bVar16 * -2 + 1;
    }
    o_01.m[1] = (float)in_stack_fffffffffffffbec;
    o_01.m[0] = (float)uVar21;
    o_01.m[2] = (float)uVar22;
    o_01.m[3] = (float)in_stack_fffffffffffffbf4;
    o_01.m[4] = (float)(int)uVar23;
    o_01.m[5] = (float)(int)((ulong)uVar23 >> 0x20);
    o_01.m[6] = (float)in_stack_fffffffffffffc00._0_4_;
    o_01.m[7] = (float)in_stack_fffffffffffffc00._4_4_;
    o_01.m[8] = (float)in_stack_fffffffffffffc00._8_4_;
    o_01.m[9] = (float)in_stack_fffffffffffffc00._12_4_;
    o_01.m[10] = (float)in_stack_fffffffffffffc00._16_4_;
    o_01.m[0xb] = (float)in_stack_fffffffffffffc00._20_4_;
    o_01.m[0xc] = (float)in_stack_fffffffffffffc00._24_4_;
    o_01.m[0xd] = (float)in_stack_fffffffffffffc00._28_4_;
    o_01.m[0xe] = (float)in_stack_fffffffffffffc00._32_4_;
    o_01.m[0xf] = (float)in_stack_fffffffffffffc00._36_4_;
    o_01.type = 1;
    mat4::operator*((mat4 *)&local_110,(mat4 *)(storedProjection.m + 0xf),o_01);
    pmVar9 = local_a0;
    pmVar12 = (mat4 *)&local_110;
    pmVar14 = local_a0;
    for (lVar7 = 0x11; lVar7 != 0; lVar7 = lVar7 + -1) {
      pmVar14->m[0] = pmVar12->m[0];
      pmVar12 = (mat4 *)((long)pmVar12 + (ulong)bVar16 * -8 + 4);
      pmVar14 = (mat4 *)((long)pmVar14 + (ulong)bVar16 * -8 + 4);
    }
    this->m_matrixState = 0xffffffff;
    glClearColor(0,0,0,0);
    glClear(0x4000);
    render(this,e + 1,e + (ulong)(*(uint *)&e->field_0x18 & 0x1fffffff) + 1);
    if ((char)local_38 != '\0') {
      local_38 = e->texture;
      GVar5 = TexturePool::acquire(local_98);
      e->texture = GVar5;
      local_68 = this->m_vertices[e->vboOffset + 4];
      uStack_60 = 0;
      local_48 = this->m_vertices[e->vboOffset + 7];
      uStack_40 = 0;
      local_198.m[0] = 1.0;
      local_198.m[1] = 0.0;
      local_198.m[2] = 0.0;
      local_198.m[3] = 0.0;
      local_198.m[4] = 0.0;
      local_198.m[5] = -1.0;
      local_198.m[6] = 0.0;
      local_198.m[7] = 0.0;
      local_198.m[8] = 0.0;
      local_198.m[9] = 0.0;
      local_198.m[10] = 1.0;
      local_198.m[0xb] = 0.0;
      local_198.m[0xc] = 0.0;
      local_198.m[0xd] = 0.0;
      local_198.m[0xe] = 0.0;
      local_198.m[0xf] = 1.0;
      local_198.type = 2;
      local_2f8 = 0x3f800000;
      uStack_2f0 = 0xbf80000000000000;
      local_2e8 = 0x3f80000000000000;
      uStack_2e0 = 0x3f80000000000000;
      local_2d8 = 0;
      local_2d0 = 0x3f800000;
      local_2cc = 0;
      uStack_2c4 = 0;
      local_2bc = 0x13f800000;
      puVar11 = &local_2f8;
      puVar13 = (undefined8 *)&stack0xfffffffffffffbe8;
      for (lVar7 = 8; lVar7 != 0; lVar7 = lVar7 + -1) {
        *puVar13 = *puVar11;
        puVar11 = puVar11 + (ulong)bVar16 * -2 + 1;
        puVar13 = puVar13 + (ulong)bVar16 * -2 + 1;
      }
      o_02.m[1] = (float)in_stack_fffffffffffffbec;
      o_02.m[0] = (float)uVar21;
      o_02.m[2] = (float)uVar22;
      o_02.m[3] = (float)in_stack_fffffffffffffbf4;
      o_02.m[4] = (float)(int)uVar23;
      o_02.m[5] = (float)(int)((ulong)uVar23 >> 0x20);
      o_02.m[6] = (float)in_stack_fffffffffffffc00._0_4_;
      o_02.m[7] = (float)in_stack_fffffffffffffc00._4_4_;
      o_02.m[8] = (float)in_stack_fffffffffffffc00._8_4_;
      o_02.m[9] = (float)in_stack_fffffffffffffc00._12_4_;
      o_02.m[10] = (float)in_stack_fffffffffffffc00._16_4_;
      o_02.m[0xb] = (float)in_stack_fffffffffffffc00._20_4_;
      o_02.m[0xc] = (float)in_stack_fffffffffffffc00._24_4_;
      o_02.m[0xd] = (float)in_stack_fffffffffffffc00._28_4_;
      o_02.m[0xe] = (float)in_stack_fffffffffffffc00._32_4_;
      o_02.m[0xf] = (float)in_stack_fffffffffffffc00._36_4_;
      o_02.type = 1;
      mat4::operator*(&local_154,&local_198,o_02);
      local_48.x = local_48.x - local_68.x;
      local_48.y = local_48.y - local_68.y;
      uStack_40 = CONCAT44(uStack_40._4_4_ - uStack_60._4_4_,(float)uStack_40 - (float)uStack_60);
      local_78 = local_48.y;
      fStack_74 = local_48.y;
      fStack_70 = local_48.y;
      fStack_6c = local_48.y;
      local_c8 = local_68.y;
      fStack_c4 = local_68.y;
      fStack_c0 = local_68.y;
      fStack_bc = local_68.y;
      local_2b0[0] = 2.0 / local_48.x;
      local_2b0[1] = 0.0;
      local_2b0[2] = 0.0;
      local_2b0[3] = 0.0;
      local_2b0[4] = 0.0;
      local_2b0[5] = -2.0 / local_48.y;
      local_298 = 0;
      uStack_290 = 0;
      local_288 = 0x3f800000;
      local_284 = 0;
      uStack_27c = 0;
      local_274 = 0x23f800000;
      pfVar10 = local_2b0;
      puVar11 = (undefined8 *)&stack0xfffffffffffffbe8;
      for (lVar7 = 8; lVar7 != 0; lVar7 = lVar7 + -1) {
        *puVar11 = *(undefined8 *)pfVar10;
        pfVar10 = pfVar10 + ((ulong)bVar16 * -2 + 1) * 2;
        puVar11 = puVar11 + (ulong)bVar16 * -2 + 1;
      }
      o_03.m[1] = (float)in_stack_fffffffffffffbec;
      o_03.m[0] = (float)uVar21;
      o_03.m[2] = (float)uVar22;
      o_03.m[3] = (float)in_stack_fffffffffffffbf4;
      o_03.m[4] = (float)(int)uVar23;
      o_03.m[5] = (float)(int)((ulong)uVar23 >> 0x20);
      o_03.m[6] = (float)in_stack_fffffffffffffc00._0_4_;
      o_03.m[7] = (float)in_stack_fffffffffffffc00._4_4_;
      o_03.m[8] = (float)in_stack_fffffffffffffc00._8_4_;
      o_03.m[9] = (float)in_stack_fffffffffffffc00._12_4_;
      o_03.m[10] = (float)in_stack_fffffffffffffc00._16_4_;
      o_03.m[0xb] = (float)in_stack_fffffffffffffc00._20_4_;
      o_03.m[0xc] = (float)in_stack_fffffffffffffc00._24_4_;
      o_03.m[0xd] = (float)in_stack_fffffffffffffc00._28_4_;
      o_03.m[0xe] = (float)in_stack_fffffffffffffc00._32_4_;
      o_03.m[0xf] = (float)in_stack_fffffffffffffc00._36_4_;
      o_03.type = 2;
      mat4::operator*((mat4 *)(storedProjection.m + 0xf),&local_154,o_03);
      local_268 = 0x3f800000;
      local_260 = 0;
      local_25c = -local_68.x;
      local_258 = 0x3f80000000000000;
      local_250 = 0;
      local_24c = -local_c8;
      local_248 = 0;
      local_240 = 0x3f800000;
      local_23c = 0;
      uStack_234 = 0;
      local_22c = 0x13f800000;
      puVar11 = &local_268;
      puVar13 = (undefined8 *)&stack0xfffffffffffffbe8;
      for (lVar7 = 8; pmVar9 = local_a0, lVar7 != 0; lVar7 = lVar7 + -1) {
        *puVar13 = *puVar11;
        puVar11 = puVar11 + (ulong)bVar16 * -2 + 1;
        puVar13 = puVar13 + (ulong)bVar16 * -2 + 1;
      }
      o_04.m[1] = (float)in_stack_fffffffffffffbec;
      o_04.m[0] = (float)uVar21;
      o_04.m[2] = (float)uVar22;
      o_04.m[3] = (float)in_stack_fffffffffffffbf4;
      o_04.m[4] = (float)(int)uVar23;
      o_04.m[5] = (float)(int)((ulong)uVar23 >> 0x20);
      o_04.m[6] = (float)in_stack_fffffffffffffc00._0_4_;
      o_04.m[7] = (float)in_stack_fffffffffffffc00._4_4_;
      o_04.m[8] = (float)in_stack_fffffffffffffc00._8_4_;
      o_04.m[9] = (float)in_stack_fffffffffffffc00._12_4_;
      o_04.m[10] = (float)in_stack_fffffffffffffc00._16_4_;
      o_04.m[0xb] = (float)in_stack_fffffffffffffc00._20_4_;
      o_04.m[0xc] = (float)in_stack_fffffffffffffc00._24_4_;
      o_04.m[0xd] = (float)in_stack_fffffffffffffc00._28_4_;
      o_04.m[0xe] = (float)in_stack_fffffffffffffc00._32_4_;
      o_04.m[0xf] = (float)in_stack_fffffffffffffc00._36_4_;
      o_04.type = 1;
      mat4::operator*((mat4 *)&local_110,(mat4 *)(storedProjection.m + 0xf),o_04);
      pmVar12 = (mat4 *)&local_110;
      pmVar14 = pmVar9;
      for (lVar7 = 0x11; lVar7 != 0; lVar7 = lVar7 + -1) {
        pmVar14->m[0] = pmVar12->m[0];
        pmVar12 = (mat4 *)((long)pmVar12 + (ulong)bVar16 * -8 + 4);
        pmVar14 = (mat4 *)((long)pmVar14 + (ulong)bVar16 * -8 + 4);
      }
      this->m_matrixState = 0xffffffff;
      iVar15 = (int)local_48.x;
      iVar8 = (int)local_78;
      glBindTexture(0xde1,e->texture);
      glTexParameteri(0xde1,0x2801,0x2601);
      glTexParameteri(0xde1,0x2800,0x2601);
      glTexParameteri(0xde1,0x2802,0x812f);
      glTexParameteri(0xde1,0x2803,0x812f);
      glTexImage2D(0xde1,0,0x1908,iVar15,iVar8,0);
      glFramebufferTexture2D(0x8d40,0x8ce0,0xde1,e->texture,0);
      glClear(0x4000);
      glViewport(0,0,iVar15,iVar8);
      uVar3 = local_38;
      if (local_a8 == (Node *)0x0) {
        if (local_90 != (Node *)0x0) {
          textureSize_00.y = fStack_84;
          textureSize_00.x = local_88;
          step.y = 0.0;
          step.x = 1.0 / local_48.x;
          drawShadowQuad(this,e->vboOffset + 4,local_38,*(int *)&local_90->field_0x34,local_48,
                         textureSize_00,step,(vec4)(ZEXT816(0x3f80000000000000) << 0x40));
          e->sourceTexture = uVar3;
        }
      }
      else {
        textureSize.y = fStack_84;
        textureSize.x = local_88;
        step_00.y = 0.0;
        step_00.x = 1.0 / local_48.x;
        drawBlurQuad(this,e->vboOffset + 4,local_38,*(int *)&local_a8->field_0x34,local_48,
                     textureSize,step_00);
        TexturePool::release(local_98,uVar3);
      }
    }
    glBindFramebuffer(0x8d40,this->m_fbo);
    glFramebufferTexture2D(0x8d40,0x8ce0,0xde1,0,0);
    GVar5 = local_54;
    glBindFramebuffer(0x8d40,local_54);
    glDeleteFramebuffers(1,local_50);
    this->m_fbo = GVar5;
    this->field_0x1f8 = local_31 & 3 | this->field_0x1f8 & 0xfc;
    pfVar10 = local_220;
    for (lVar7 = 0x11; lVar7 != 0; lVar7 = lVar7 + -1) {
      pmVar9->m[0] = *pfVar10;
      pfVar10 = pfVar10 + (ulong)bVar16 * -2 + 1;
      pmVar9 = (mat4 *)((long)pmVar9 + (ulong)bVar16 * -8 + 4);
    }
    this->m_matrixState = 0xffffffff;
    this->m_surfaceSize = local_b0;
  }
  return;
}

Assistant:

inline void OpenGLRenderer::renderToLayer(Element *e)
{
    // string space;
    // for (int i=0; i<recursion; ++i)
    //     space += "    ";
    // std::cout << space << "- doing layered rendering for: element=" << e << " node=" << e->node << std::endl;
    assert(e->layered);

    // Create the FBO
    rect2d devRect = boundingRectFor(e->vboOffset);

    // Abort the render to layer pass if the dev rect happens to be zero..
    if (devRect.width() <= 0 || devRect.height() <= 0) {
        return;
    }

    // Store current state...
    bool stored3d = m_render3d;
    bool storedTextureed = m_layered;
    GLuint storedFbo = m_fbo;
    mat4 storedProjection = m_proj;
    vec2 storedSize = m_surfaceSize;

    m_render3d |= e->projection;
    m_layered = true;


    BlurNode *blurNode = BlurNode::from(e->node);
    ShadowNode *shadowNode = ShadowNode::from(e->node);

    if (blurNode || shadowNode) {
        devRect.tl -= 1.0f;
        devRect.br += 1.0f;
    }

    // std::cout << space << " ---> from " << e->vboOffset << " " << m_vertices[e->vboOffset] << " " << m_vertices[e->vboOffset+3] << std::endl;

    m_surfaceSize = devRect.size();

    e->texture = m_texturePool.acquire();
    rengine_create_texture(e->texture, devRect.width(), devRect.height());

    glGenFramebuffers(1, &m_fbo);
    glBindFramebuffer(GL_FRAMEBUFFER, m_fbo);
    glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, e->texture, 0);

#ifndef NDEBUG
    // Only enabled in debug mode because it syncs the GL stack and takes forever..
    if (glCheckFramebufferStatus(GL_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE) {
        logw << "FBO failed, devRect=" << devRect
             << ", dim=" << devRect.width() << "x" << devRect.height() << ", tex=" << e->texture << ", fbo=" << m_fbo << ", error="
             << std::hex << glCheckFramebufferStatus(GL_FRAMEBUFFER) << std::endl;
        assert(false);
    }
#endif

    // Render the layered group
    m_proj = mat4::scale2D(1.0, -1.0)
             * mat4::translate2D(-1.0, 1.0)
             * mat4::scale2D(2.0f / devRect.width(), -2.0f / devRect.height())
             * mat4::translate2D(-devRect.tl.x, -devRect.tl.y);
    m_matrixState = UpdateAllPrograms;

    // std::cout << " ---> rect=" << devRect << " texture=" << e->texture << " fbo=" << m_fbo
    //           << " status=" << hex << glCheckFramebufferStatus(GL_FRAMEBUFFER) << " ok=" << GL_FRAMEBUFFER_COMPLETE
    //           << " " << m_proj << std::endl;

    glClearColor(0, 0, 0, 0);
    glClear(GL_COLOR_BUFFER_BIT);
    render(e + 1, e + e->groupSize + 1);

    if (blurNode || shadowNode) {
        int tmpTex = e->texture;
        e->texture = m_texturePool.acquire();
        rect2d expandedWidth = boundingRectFor(e->vboOffset + 4);
        m_proj = mat4::scale2D(1.0, -1.0)
                 * mat4::translate2D(-1.0, 1.0)
                 * mat4::scale2D(2.0f / expandedWidth.width(), -2.0f / expandedWidth.height())
                 * mat4::translate2D(-expandedWidth.tl.x, -expandedWidth.tl.y);
        m_matrixState = UpdateAllPrograms;
        rengine_create_texture(e->texture, expandedWidth.width(), expandedWidth.height());
        glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, e->texture, 0);
        glClear(GL_COLOR_BUFFER_BIT);
        glViewport(0, 0, expandedWidth.width(), expandedWidth.height());
        if (blurNode) {
            drawBlurQuad(e->vboOffset + 4, tmpTex, blurNode->radius(), expandedWidth.size(), devRect.size(), vec2(1/expandedWidth.width(), 0));
            m_texturePool.release(tmpTex);
        } else if (shadowNode) {
            drawShadowQuad(e->vboOffset + 4, tmpTex, shadowNode->radius(), expandedWidth.size(), devRect.size(), vec2(1/expandedWidth.width(), 0), vec4(0, 0, 0, 1));
            e->sourceTexture = tmpTex;
        }
    }

    // Reset the GL state..
    glBindFramebuffer(GL_FRAMEBUFFER, m_fbo);
    glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, 0, 0);
    glBindFramebuffer(GL_FRAMEBUFFER, storedFbo);
    glDeleteFramebuffers(1, &m_fbo);

    // Reset the old state...
    m_fbo = storedFbo;
    m_render3d = stored3d;
    m_layered = storedTextureed;
    m_proj = storedProjection;
    m_matrixState = UpdateAllPrograms;
    m_surfaceSize = storedSize;

    // std::cout << space << "- layer is completed..." << std::endl;
}